

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O2

void * __thiscall
PosixLockedPageAllocator::AllocateLocked
          (PosixLockedPageAllocator *this,size_t len,bool *lockingSuccess)

{
  long lVar1;
  int iVar2;
  void *__addr;
  void *pvVar3;
  ulong __len;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __len = -this->page_size & (len + this->page_size) - 1;
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  pvVar3 = (void *)0x0;
  if ((__addr != (void *)0xffffffffffffffff) && (pvVar3 = __addr, __addr != (void *)0x0)) {
    iVar2 = mlock(__addr,__len);
    *lockingSuccess = iVar2 == 0;
    madvise(__addr,__len,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pvVar3;
}

Assistant:

void *PosixLockedPageAllocator::AllocateLocked(size_t len, bool *lockingSuccess)
{
    void *addr;
    len = align_up(len, page_size);
    addr = mmap(nullptr, len, PROT_READ|PROT_WRITE, MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
    if (addr == MAP_FAILED) {
        return nullptr;
    }
    if (addr) {
        *lockingSuccess = mlock(addr, len) == 0;
#if defined(MADV_DONTDUMP) // Linux
        madvise(addr, len, MADV_DONTDUMP);
#elif defined(MADV_NOCORE) // FreeBSD
        madvise(addr, len, MADV_NOCORE);
#endif
    }
    return addr;
}